

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translit.cpp
# Opt level: O0

int32_t __thiscall
icu_63::Transliterator::transliterate
          (Transliterator *this,Replaceable *text,int32_t start,int32_t limit)

{
  int32_t iVar1;
  int32_t local_38;
  int32_t local_34;
  UTransPosition offsets;
  int32_t limit_local;
  int32_t start_local;
  Replaceable *text_local;
  Transliterator *this_local;
  
  if (((-1 < start) && (start <= limit)) &&
     (offsets.start = limit, offsets.limit = start, iVar1 = Replaceable::length(text),
     offsets.start <= iVar1)) {
    local_38 = offsets.limit;
    local_34 = offsets.start;
    offsets.contextStart = offsets.limit;
    offsets.contextLimit = offsets.start;
    (*(this->super_UObject)._vptr_UObject[0xc])(this,text,&local_38,0,1);
    return offsets.contextLimit;
  }
  return -1;
}

Assistant:

int32_t Transliterator::transliterate(Replaceable& text,
                                      int32_t start, int32_t limit) const {
    if (start < 0 ||
        limit < start ||
        text.length() < limit) {
        return -1;
    }

    UTransPosition offsets;
    offsets.contextStart= start;
    offsets.contextLimit = limit;
    offsets.start = start;
    offsets.limit = limit;
    filteredTransliterate(text, offsets, FALSE, TRUE);
    return offsets.limit;
}